

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::AddString(cmCommandArgumentParserHelper *this,string *str)

{
  ulong uVar1;
  pointer __dest;
  char *__src;
  reference this_00;
  unique_ptr<char[],_std::default_delete<char[]>_> local_28;
  __array stVal;
  string *str_local;
  cmCommandArgumentParserHelper *this_local;
  
  stVal._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)str;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    std::make_unique<char[]>((size_t)&local_28);
    __dest = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_28);
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(__dest,__src);
    std::
    vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
    ::push_back(&this->Variables,&local_28);
    this_00 = std::
              vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
              ::back(&this->Variables);
    this_local = (cmCommandArgumentParserHelper *)
                 std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_28);
  }
  else {
    this_local = (cmCommandArgumentParserHelper *)0x1198ba7;
  }
  return (char *)this_local;
}

Assistant:

const char* cmCommandArgumentParserHelper::AddString(const std::string& str)
{
  if (str.empty()) {
    return "";
  }
  auto stVal = cm::make_unique<char[]>(str.size() + 1);
  strcpy(stVal.get(), str.c_str());
  this->Variables.push_back(std::move(stVal));
  return this->Variables.back().get();
}